

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O2

void __thiscall absl::lts_20250127::substitute_internal::Arg::Arg(Arg *this,unsigned_long value)

{
  char *buffer;
  Nonnull<char_*> pcVar1;
  
  buffer = this->scratch_;
  pcVar1 = numbers_internal::FastIntToBuffer(value,buffer);
  (this->piece_)._M_len = (long)pcVar1 - (long)buffer;
  (this->piece_)._M_str = buffer;
  return;
}

Assistant:

Arg(unsigned long value)  // NOLINT(*)
      : piece_(scratch_,
               static_cast<size_t>(
                   numbers_internal::FastIntToBuffer(value, scratch_) -
                   scratch_)) {}